

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O2

void set_ksl_wave_fb(YM2413 *chip,int chan,int v)

{
  UINT32 UVar1;
  UINT8 UVar2;
  UINT8 UVar3;
  
  UVar2 = (UINT8)(v & 7U);
  UVar3 = UVar2 + '\b';
  if ((v & 7U) == 0) {
    UVar3 = UVar2;
  }
  chip->P_CH[(uint)chan].SLOT[0].wavetable = (v & 8U) << 7;
  chip->P_CH[(uint)chan].SLOT[0].fb_shift = UVar3;
  UVar1 = ksl_shift[(uint)v >> 6];
  chip->P_CH[(uint)chan].SLOT[1].ksl = (byte)UVar1;
  chip->P_CH[(uint)chan].SLOT[1].TLL =
       (chip->P_CH[(uint)chan].ksl_base >> ((byte)UVar1 & 0x1f)) + chip->P_CH[(uint)chan].SLOT[1].TL
  ;
  chip->P_CH[(uint)chan].SLOT[1].wavetable = (v & 0x10U) << 6;
  return;
}

Assistant:

INLINE void set_ksl_wave_fb(YM2413 *chip,int chan,int v)
{
	OPLL_CH   *CH   = &chip->P_CH[chan];
/* modulator */
	OPLL_SLOT *SLOT = &CH->SLOT[SLOT1];
	SLOT->wavetable = ((v&0x08)>>3)*SIN_LEN;
	SLOT->fb_shift  = (v&7) ? (v&7) + 8 : 0;

/*carrier*/
	SLOT = &CH->SLOT[SLOT2];

	SLOT->ksl = ksl_shift[v >> 6];
	SLOT->TLL = SLOT->TL + (CH->ksl_base>>SLOT->ksl);

	SLOT->wavetable = ((v&0x10)>>4)*SIN_LEN;
}